

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  long lVar4;
  bool *pbVar5;
  bool bVar6;
  cmLocalGenerator *this_00;
  allocator local_101;
  bool *local_100;
  cmSourceFile *local_f8;
  cmLocalGenerator *local_f0;
  string lang;
  string objectName;
  string relFromBinary;
  string repVar;
  string relFromSource;
  
  local_100 = hasSourceExtension;
  local_f8 = source;
  psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  pcVar3 = GetCurrentSourceDirectory(this);
  std::__cxx11::string::string((string *)&relFromBinary,pcVar3,(allocator *)&objectName);
  cmOutputConverter::ConvertToRelativePath
            (&relFromSource,&this->super_cmOutputConverter,&relFromBinary,psVar2);
  local_f0 = this;
  std::__cxx11::string::~string((string *)&relFromBinary);
  if (relFromSource._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x932,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(relFromSource._M_dataplus._M_p);
  pcVar3 = GetCurrentBinaryDirectory(local_f0);
  std::__cxx11::string::string((string *)&objectName,pcVar3,(allocator *)&lang);
  cmOutputConverter::ConvertToRelativePath
            (&relFromBinary,&this->super_cmOutputConverter,&objectName,psVar2);
  std::__cxx11::string::~string((string *)&objectName);
  if (relFromBinary._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x939,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(relFromBinary._M_dataplus._M_p);
  objectName._M_dataplus._M_p = (pointer)&objectName.field_2;
  objectName._M_string_length = 0;
  objectName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&objectName);
  this_00 = local_f0;
  bVar1 = cmsys::SystemTools::FileIsFullPath(objectName._M_dataplus._M_p);
  if ((bVar1) && (bVar1 = cmake::GetIsInTryCompile(this_00->GlobalGenerator->CMakeInstance), bVar1))
  {
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(local_f8);
    cmsys::SystemTools::GetFilenameName(&lang,psVar2);
    std::__cxx11::string::operator=((string *)&objectName,(string *)&lang);
    std::__cxx11::string::~string((string *)&lang);
  }
  std::__cxx11::string::string((string *)&lang,"KEEP_EXTENSION",(allocator *)&repVar);
  bVar1 = cmSourceFile::GetPropertyAsBool(local_f8,&lang);
  std::__cxx11::string::~string((string *)&lang);
  pbVar5 = local_100;
  bVar6 = true;
  if (bVar1) goto LAB_003aa71b;
  bVar1 = NeedBackwardsCompatibility_2_4(this_00);
  if (bVar1) {
LAB_003aa5c8:
    lVar4 = std::__cxx11::string::rfind((char)&objectName,0x2e);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&lang,(ulong)&objectName);
      std::__cxx11::string::operator=((string *)&objectName,(string *)&lang);
      std::__cxx11::string::~string((string *)&lang);
      pbVar5 = local_100;
    }
    if (customOutputExtension != (char *)0x0) {
      std::__cxx11::string::append((char *)&objectName);
      bVar6 = false;
      this_00 = local_f0;
      goto LAB_003aa71b;
    }
    bVar6 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&lang,local_f8);
    if (lang._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string((string *)&repVar,"CMAKE_",&local_101);
      std::__cxx11::string::append((string *)&repVar);
      std::__cxx11::string::append((char *)&repVar);
      bVar1 = cmMakefile::IsOn(this_00->Makefile,&repVar);
      std::__cxx11::string::~string((string *)&repVar);
    }
    std::__cxx11::string::~string((string *)&lang);
    pbVar5 = local_100;
    if ((customOutputExtension != (char *)0x0) || (bVar6 = true, bVar1 != false)) goto LAB_003aa5c8;
  }
  this_00 = local_f0;
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_(&lang,local_f0->GlobalGenerator,local_f8)
  ;
  std::__cxx11::string::append((string *)&objectName);
  std::__cxx11::string::~string((string *)&lang);
LAB_003aa71b:
  if (pbVar5 != (bool *)0x0) {
    *pbVar5 = bVar6;
  }
  psVar2 = CreateSafeUniqueObjectFileName(this_00,&objectName,dir_max);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::~string((string *)&objectName);
  std::__cxx11::string::~string((string *)&relFromBinary);
  std::__cxx11::string::~string((string *)&relFromSource);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource =
    this->ConvertToRelativePath(this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource.c_str());
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary =
    this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary.c_str());
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource)) {
    objectName = relFromBinary;
  } else if (relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName.c_str())) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        std::string repVar = "CMAKE_";
        repVar += lang;
        repVar += "_OUTPUT_EXTENSION_REPLACE";
        replaceExt = this->Makefile->IsOn(repVar);
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}